

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestVector.cpp
# Opt level: O0

void __thiscall celero::TestVector::push_back(TestVector *this,shared_ptr<celero::Benchmark> *x)

{
  Impl *pIVar1;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> mutexLock;
  shared_ptr<celero::Benchmark> *x_local;
  TestVector *this_local;
  
  mutexLock._M_device = (mutex_type *)x;
  pIVar1 = Pimpl<celero::TestVector::Impl>::operator->(&this->pimpl);
  std::lock_guard<std::mutex>::lock_guard(&local_20,&pIVar1->testVectorMutex);
  pIVar1 = Pimpl<celero::TestVector::Impl>::operator->(&this->pimpl);
  std::
  vector<std::shared_ptr<celero::Benchmark>,_std::allocator<std::shared_ptr<celero::Benchmark>_>_>::
  push_back(&pIVar1->testVector,x);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void TestVector::push_back(std::shared_ptr<Benchmark> x)
{
	std::lock_guard<std::mutex> mutexLock(this->pimpl->testVectorMutex);
	this->pimpl->testVector.push_back(x);
}